

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O1

TPZIntPoints * __thiscall TPZReducedSpace::GetIntegrationRule(TPZReducedSpace *this)

{
  TPZIntPoints *pTVar1;
  
  pTVar1 = (TPZIntPoints *)(**(code **)(*(long *)&this->fReferred->super_TPZCompEl + 0x2c8))();
  return pTVar1;
}

Assistant:

TPZInterpolationSpace *TPZReducedSpace::ReferredIntel() const
{
    return fReferred;
//     TPZCompMeshReferred *cmeshref = dynamic_cast<TPZCompMeshReferred *>(cmesh);
    
// #ifdef PZDEBUG
//     if (!cmeshref) {
//         DebugStop();
//     }
// #endif
    
//     TPZCompEl *cel = cmeshref->ReferredEl(Index());
    
// #ifdef PZDEBUG
//     if (!cel) {
//         DebugStop();
//     }
// #endif
    
//     TPZInterpolationSpace *intel = dynamic_cast<TPZInterpolationSpace *>(cel);
    
    
//     TPZMultiphysicsElement * mf_cel = dynamic_cast<TPZMultiphysicsElement *>(cel);

// #ifdef PZDEBUG
//     if (!intel && !mf_cel) {
//         DebugStop();
//     }
// #endif
    
//     if (intel) {
//         return intel;
//     }
    
//     TPZInterpolationSpace * intel_mf = dynamic_cast<TPZInterpolationSpace * >(mf_cel->Element(0)); //@omar:: garbage solution
//     if(intel_mf){
//         return intel_mf;
//     }
    
//     return intel;
}